

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall
Omega_h::clamp_metrics_dim<2>(Omega_h *this,LO nmetrics,Reals *metrics,Real h_min,Real h_max)

{
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_c0;
  undefined1 local_b0 [8];
  type functor;
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  Write<double> out;
  Real h_max_local;
  Real h_min_local;
  Reals *metrics_local;
  LO nmetrics_local;
  
  out.shared_alloc_.direct_ptr = (void *)h_max;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  Write<double>::Write((Write<double> *)local_48,nmetrics * 3,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  Read<double>::Read((Read<double> *)local_b0,metrics);
  functor.h_min = (Real)out.shared_alloc_.direct_ptr;
  functor.metrics.write_.shared_alloc_.direct_ptr = (void *)h_min;
  Write<double>::Write((Write<double> *)&functor.h_max,(Write<double> *)local_48);
  parallel_for<Omega_h::clamp_metrics_dim<2>(int,Omega_h::Read<double>,double,double)::_lambda(int)_1_>
            ("clamp_metrics",nmetrics,(type *)local_b0);
  Write<double>::Write(&local_c0,(Write<signed_char> *)local_48);
  Read<double>::Read((Read<double> *)this,&local_c0);
  Write<double>::~Write(&local_c0);
  clamp_metrics_dim<2>(int,Omega_h::Read<double>,double,double)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_b0);
  Write<double>::~Write((Write<double> *)local_48);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals clamp_metrics_dim(
    LO nmetrics, Reals metrics, Real h_min, Real h_max) {
  auto out = Write<Real>(nmetrics * symm_ncomps(dim));
  auto functor = OMEGA_H_LAMBDA(LO i) {
    auto m = get_symm<dim>(metrics, i);
    m = clamp_metric(m, h_min, h_max);
    set_symm(out, i, m);
  };
  parallel_for("clamp_metrics", nmetrics, std::move(functor));
  return out;
}